

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

socket_t __thiscall
httplib::Server::create_server_socket
          (Server *this,string *host,int port,int socket_flags,SocketOptions *socket_options)

{
  bool bVar1;
  int iVar2;
  _Manager_type p_Var3;
  socket_t sVar4;
  undefined4 in_register_00000014;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = 0;
  iVar2 = this->address_family_;
  bVar1 = this->tcp_nodelay_;
  local_48 = (_Manager_type)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = socket_options->_M_invoker;
  p_Var3 = (socket_options->super__Function_base)._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(socket_options->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(socket_options->super__Function_base)._M_functor + 8);
    (socket_options->super__Function_base)._M_manager = (_Manager_type)0x0;
    socket_options->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var3;
  }
  local_38 = &local_28;
  sVar4 = detail::
          create_socket<httplib::Server::create_server_socket(std::__cxx11::string_const&,int,int,std::function<void(int)>)const::_lambda(int,addrinfo&)_1_>
                    (host,&local_38,CONCAT44(in_register_00000014,port),iVar2,socket_flags,bVar1,
                     &local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return sVar4;
}

Assistant:

inline socket_t
Server::create_server_socket(const std::string &host, int port,
                             int socket_flags,
                             SocketOptions socket_options) const {
  return detail::create_socket(
      host, std::string(), port, address_family_, socket_flags, tcp_nodelay_,
      std::move(socket_options),
      [](socket_t sock, struct addrinfo &ai) -> bool {
        if (::bind(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen))) {
          return false;
        }
        if (::listen(sock, CPPHTTPLIB_LISTEN_BACKLOG)) { return false; }
        return true;
      });
}